

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

AActor * P_LinePickActor(AActor *t1,DAngle *angle,double distance,DAngle *pitch,
                        ActorFlags *actorMask,DWORD wallMask)

{
  sector_t_conflict *sector;
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  TFlags<ActorFlag,_unsigned_int> local_17c;
  DVector3 local_178;
  undefined1 local_160 [8];
  Origin TData;
  FTraceResults trace;
  double pc;
  double shootz;
  DVector3 direction;
  DWORD wallMask_local;
  ActorFlags *actorMask_local;
  DAngle *pitch_local;
  double distance_local;
  DAngle *angle_local;
  AActor *t1_local;
  
  direction.Z._4_4_ = wallMask;
  TVector3<double>::TVector3((TVector3<double> *)&shootz);
  dVar2 = TAngle<double>::Cos(pitch);
  dVar3 = TAngle<double>::Cos(angle);
  dVar4 = TAngle<double>::Sin(angle);
  dVar5 = TAngle<double>::Sin(pitch);
  TVector3<double>::TVector3
            ((TVector3<double> *)&trace.Crossed3DWaterPos.Z,dVar2 * dVar3,dVar2 * dVar4,-dVar5);
  TVector3<double>::operator=
            ((TVector3<double> *)&shootz,(TVector3<double> *)&trace.Crossed3DWaterPos.Z);
  dVar2 = AActor::Center(t1);
  dVar2 = dVar2 - t1->Floorclip;
  if (t1->player == (player_t *)0x0) {
    pc = dVar2 + 8.0;
  }
  else {
    pc = t1->player->mo->AttackZOffset * t1->player->crouchfactor + dVar2;
  }
  FTraceResults::FTraceResults((FTraceResults *)&TData.PuffSpecies);
  Origin::Origin((Origin *)local_160);
  TData.Caller._4_1_ = 1;
  TData.Caller._5_1_ = 0;
  TData.Caller._7_1_ = 0;
  TData.Caller._6_1_ = 0;
  local_160 = (undefined1  [8])t1;
  AActor::PosAtZ(&local_178,t1,pc);
  sector = (sector_t_conflict *)t1->Sector;
  TFlags<ActorFlag,_unsigned_int>::TFlags(&local_17c,actorMask);
  bVar1 = Trace(&local_178,sector,(DVector3 *)&shootz,distance,&local_17c,direction.Z._4_4_,t1,
                (FTraceResults *)&TData.PuffSpecies,9,CheckForActor,local_160);
  if ((bVar1) && (trace.Line._4_4_ == 4)) {
    t1_local = (AActor *)trace.Fraction;
  }
  else {
    t1_local = (AActor *)0x0;
  }
  return t1_local;
}

Assistant:

AActor *P_LinePickActor(AActor *t1, DAngle angle, double distance, DAngle pitch, ActorFlags actorMask, DWORD wallMask) 
{
	DVector3 direction;
	double shootz;

	double pc = pitch.Cos();
	direction = { pc * angle.Cos(), pc * angle.Sin(), -pitch.Sin() };
	shootz = t1->Center() - t1->Floorclip;

	if (t1->player != NULL)
	{
		shootz += t1->player->mo->AttackZOffset * t1->player->crouchfactor;
	}
	else
	{
		shootz += 8;
	}

	FTraceResults trace;
	Origin TData;
	
	TData.Caller = t1;
	TData.hitGhosts = true;
	TData.MThruSpecies = false;
	TData.ThruActors = false;
	TData.ThruSpecies = false;
	
	if (Trace(t1->PosAtZ(shootz), t1->Sector, direction, distance,
		actorMask, wallMask, t1, trace, TRACE_NoSky | TRACE_PortalRestrict, CheckForActor, &TData))
	{
		if (trace.HitType == TRACE_HitActor)
		{
			return trace.Actor;
		}
	}

	return NULL;
}